

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O2

void read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    iVar1 = uv_shutdown((uv_shutdown_t *)(stream + 1),stream,shutdown_cb);
    if (iVar1 == 0) {
      return;
    }
    pcVar2 = "r == 0";
    uStack_10 = 0x54;
  }
  else {
    pcVar2 = "nread == UV_EOF";
    uStack_10 = 0x4f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/blackhole-server.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {

  ASSERT_NOT_NULL(stream);

#if DEBUG
  printf("read_cb %d\n", p->i);
#endif

  uv_close((uv_handle_t*)stream, close_cb);

  if (nread < 0) {
    if (nread == UV_EOF) {
      ;
    } else if (nread == UV_ECONNRESET) {
      conns_failed++;
    } else {
      fprintf(stderr, "read error %s\n", uv_err_name(nread));
      ASSERT(0);
    }
  }
}